

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseHTML(TidyDocImpl *doc,Node *html,GetTokenMode mode)

{
  Bool BVar1;
  Node *pNVar2;
  Node *local_40;
  Node *noframes;
  Node *frameset;
  Node *head;
  Node *node;
  GetTokenMode mode_local;
  Node *html_local;
  TidyDocImpl *doc_local;
  
  noframes = (Node *)0x0;
  local_40 = (Node *)0x0;
  prvTidySetOptionBool(doc,TidyXmlTags,no);
  do {
    while( true ) {
      while( true ) {
        head = prvTidyGetToken(doc,IgnoreWhitespace);
        if (head == (Node *)0x0) {
          head = prvTidyInferredTag(doc,TidyTag_HEAD);
          goto LAB_0014cb12;
        }
        if (((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) && (head->tag->id == TidyTag_HEAD)
           ) goto LAB_0014cb12;
        if ((head->tag != html->tag) || (head->type != EndTag)) break;
        prvTidyReport(doc,html,head,0x235);
        prvTidyFreeNode(doc,head);
      }
      if ((head->tag != html->tag) || (head->type != StartTag)) break;
      prvTidyReport(doc,html,head,0x235);
      prvTidyFreeNode(doc,head);
    }
    BVar1 = InsertMisc(html,head);
  } while (BVar1 != no);
  prvTidyUngetToken(doc);
  head = prvTidyInferredTag(doc,TidyTag_HEAD);
LAB_0014cb12:
  prvTidyInsertNodeAtEnd(html,head);
  prvTidyParseHead(doc,head,mode);
LAB_0014cb37:
  do {
    while( true ) {
      head = prvTidyGetToken(doc,IgnoreWhitespace);
      if (head == (Node *)0x0) {
        if (noframes == (Node *)0x0) {
          pNVar2 = prvTidyInferredTag(doc,TidyTag_BODY);
          prvTidyInsertNodeAtEnd(html,pNVar2);
          prvTidyParseBody(doc,pNVar2,mode);
        }
        return;
      }
      if (head->tag != html->tag) break;
      if ((head->type != StartTag) && (noframes == (Node *)0x0)) {
        prvTidyReport(doc,html,head,0x235);
      }
      prvTidyFreeNode(doc,head);
    }
    BVar1 = InsertMisc(html,head);
  } while (BVar1 != no);
  if (((head == (Node *)0x0) || (head->tag == (Dict *)0x0)) || (head->tag->id != TidyTag_BODY)) {
    if (((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) && (head->tag->id == TidyTag_FRAMESET)
       ) {
      if (head->type == StartTag) {
        pNVar2 = head;
        if (noframes != (Node *)0x0) {
          prvTidyReport(doc,html,head,0x237);
          pNVar2 = noframes;
        }
        noframes = pNVar2;
        prvTidyInsertNodeAtEnd(html,head);
        ParseTag(doc,head,mode);
        for (head = noframes->content; head != (Node *)0x0; head = head->next) {
          if (((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) &&
             (head->tag->id == TidyTag_NOFRAMES)) {
            local_40 = head;
          }
        }
      }
      else {
        prvTidyReport(doc,html,head,0x235);
        prvTidyFreeNode(doc,head);
      }
      goto LAB_0014cb37;
    }
    if (((head != (Node *)0x0) && (head->tag != (Dict *)0x0)) && (head->tag->id == TidyTag_NOFRAMES)
       ) {
      if (head->type == StartTag) {
        if (noframes == (Node *)0x0) {
          prvTidyReport(doc,html,head,0x235);
          prvTidyFreeNode(doc,head);
          head = prvTidyInferredTag(doc,TidyTag_BODY);
          goto LAB_0014d037;
        }
        if (local_40 == (Node *)0x0) {
          prvTidyInsertNodeAtEnd(noframes,head);
          local_40 = head;
        }
        else {
          prvTidyFreeNode(doc,head);
        }
        ParseTag(doc,local_40,mode);
      }
      else {
        prvTidyReport(doc,html,head,0x235);
        prvTidyFreeNode(doc,head);
      }
      goto LAB_0014cb37;
    }
    BVar1 = prvTidynodeIsElement(head);
    if (BVar1 != no) {
      if ((head->tag != (Dict *)0x0) && ((head->tag->model & 4) != 0)) {
        MoveToHead(doc,html,head);
        goto LAB_0014cb37;
      }
      if (((noframes != (Node *)0x0) && (head != (Node *)0x0)) &&
         ((head->tag != (Dict *)0x0 && (head->tag->id == TidyTag_FRAME)))) {
        prvTidyReport(doc,html,head,0x235);
        prvTidyFreeNode(doc,head);
        goto LAB_0014cb37;
      }
    }
    prvTidyUngetToken(doc);
    if (noframes != (Node *)0x0) {
      if (local_40 == (Node *)0x0) {
        local_40 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
        prvTidyInsertNodeAtEnd(noframes,local_40);
      }
      else {
        prvTidyReport(doc,html,head,0x267);
        if (local_40->type == StartEndTag) {
          local_40->type = StartTag;
        }
      }
      prvTidyConstrainVersion(doc,0x490);
      ParseTag(doc,local_40,mode);
      goto LAB_0014cb37;
    }
    head = prvTidyInferredTag(doc,TidyTag_BODY);
    if ((int)(doc->config).value[6].v != 1) {
      prvTidyReport(doc,html,head,0x247);
    }
    prvTidyConstrainVersion(doc,0xfffffb6f);
  }
  else {
    if (head->type != StartTag) {
      prvTidyReport(doc,html,head,0x235);
      prvTidyFreeNode(doc,head);
      goto LAB_0014cb37;
    }
    if (((doc->config).value[1].v == 0) && (noframes != (Node *)0x0)) {
      prvTidyUngetToken(doc);
      if (local_40 == (Node *)0x0) {
        local_40 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
        prvTidyInsertNodeAtEnd(noframes,local_40);
        prvTidyReport(doc,html,local_40,0x247);
      }
      else if (local_40->type == StartEndTag) {
        local_40->type = StartTag;
      }
      ParseTag(doc,local_40,mode);
      goto LAB_0014cb37;
    }
    prvTidyConstrainVersion(doc,0xfffffb6f);
  }
LAB_0014d037:
  prvTidyInsertNodeAtEnd(html,head);
  ParseTag(doc,head,mode);
  return;
}

Assistant:

void TY_(ParseHTML)(TidyDocImpl* doc, Node *html, GetTokenMode mode)
{
    Node *node, *head;
    Node *frameset = NULL;
    Node *noframes = NULL;

    DEBUG_LOG(SPRTF("Entering ParseHTML...\n"));
    TY_(SetOptionBool)( doc, TidyXmlTags, no );

    for (;;)
    {
        node = TY_(GetToken)(doc, IgnoreWhitespace);

        if (node == NULL)
        {
            node = TY_(InferredTag)(doc, TidyTag_HEAD);
            break;
        }

        if ( nodeIsHEAD(node) )
            break;

        if (node->tag == html->tag && node->type == EndTag)
        {
            TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* find and discard multiple <html> elements */
        if (node->tag == html->tag && node->type == StartTag)
        {
            TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(html, node))
            continue;

        TY_(UngetToken)( doc );
        node = TY_(InferredTag)(doc, TidyTag_HEAD);
        break;
    }

    head = node;
    TY_(InsertNodeAtEnd)(html, head);
    TY_(ParseHead)(doc, head, mode);

    for (;;)
    {
        node = TY_(GetToken)(doc, IgnoreWhitespace);

        if (node == NULL)
        {
            if (frameset == NULL) /* implied body */
            {
                node = TY_(InferredTag)(doc, TidyTag_BODY);
                TY_(InsertNodeAtEnd)(html, node);
                TY_(ParseBody)(doc, node, mode);
            }

            DEBUG_LOG(SPRTF("Exit ParseHTML 1...\n"));
            return;
        }

        /* robustly handle html tags */
        if (node->tag == html->tag)
        {
            if (node->type != StartTag && frameset == NULL)
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(html, node))
            continue;

        /* if frameset document coerce <body> to <noframes> */
        if ( nodeIsBODY(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
            {
                if (frameset != NULL)
                {
                    TY_(UngetToken)( doc );

                    if (noframes == NULL)
                    {
                        noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                        TY_(Report)(doc, html, noframes, INSERTING_TAG);
                    }
                    else
                    {
                        if (noframes->type == StartEndTag)
                            noframes->type = StartTag;
                    }

                    ParseTag(doc, noframes, mode);
                    continue;
                }
            }

            TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
            break;  /* to parse body */
        }

        /* flag an error if we see more than one frameset */
        if ( nodeIsFRAMESET(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if (frameset != NULL)
                TY_(Report)(doc, html, node, DUPLICATE_FRAMESET);
            else
                frameset = node;

            TY_(InsertNodeAtEnd)(html, node);
            ParseTag(doc, node, mode);

            /*
              see if it includes a noframes element so
              that we can merge subsequent noframes elements
            */

            for (node = frameset->content; node; node = node->next)
            {
                if ( nodeIsNOFRAMES(node) )
                    noframes = node;
            }
            continue;
        }

        /* if not a frameset document coerce <noframes> to <body> */
        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if (frameset == NULL)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                node = TY_(InferredTag)(doc, TidyTag_BODY);
                break;
            }

            if (noframes == NULL)
            {
                noframes = node;
                TY_(InsertNodeAtEnd)(frameset, noframes);
            }
            else
                TY_(FreeNode)( doc, node);

            ParseTag(doc, noframes, mode);
            continue;
        }

        if (TY_(nodeIsElement)(node))
        {
            if (node->tag && node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, html, node);
                continue;
            }

            /* discard illegal frame element following a frameset */
            if ( frameset != NULL && nodeIsFRAME(node) )
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
        }

        TY_(UngetToken)( doc );

        /* insert other content into noframes element */

        if (frameset)
        {
            if (noframes == NULL)
            {
                noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                TY_(InsertNodeAtEnd)(frameset, noframes);
            }
            else
            {
                TY_(Report)(doc, html, node, NOFRAMES_CONTENT);
                if (noframes->type == StartEndTag)
                    noframes->type = StartTag;
            }

            TY_(ConstrainVersion)(doc, VERS_FRAMESET);
            ParseTag(doc, noframes, mode);
            continue;
        }

        node = TY_(InferredTag)(doc, TidyTag_BODY);
        /* Issue #132 - disable inserting BODY tag warning
           BUT only if NOT --show-body-only yes */
        if (!showingBodyOnly(doc))
            TY_(Report)(doc, html, node, INSERTING_TAG );
        TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
        break;
    }

    /* node must be body */

    TY_(InsertNodeAtEnd)(html, node);
    ParseTag(doc, node, mode);
    DEBUG_LOG(SPRTF("Exit ParseHTML 2...\n"));
}